

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InitialValueCase::iterate(InitialValueCase *this)

{
  bool bVar1;
  int iVar2;
  GLenum err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  float (*pafVar6) [8];
  MessageBuilder local_548;
  float (*local_3c8) [8];
  float (*local_3c0) [8];
  Array<float_*> local_3b8;
  MessageBuilder local_3a8;
  undefined4 local_224;
  MessageBuilder local_220;
  undefined1 local_90 [8];
  CallLogWrapper gl;
  StateQueryMemoryWriteGuard<float[8]> state;
  InitialValueCase *this_local;
  
  gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[8]> *)&gl.m_enableLog);
  pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_90,(Functions *)CONCAT44(extraout_var,iVar2),pTVar4);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_90,true);
  pTVar4 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_220,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (&local_220,
                      (char (*) [79])
                      "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)"
                     );
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_220);
  pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
  glu::CallLogWrapper::glGetFloatv((CallLogWrapper *)local_90,0x92be,*pafVar6);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_90);
  glu::checkError(err,"query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xbe);
  bVar1 = gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[8]> *)&gl.m_enableLog,
                     (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if (bVar1) {
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_3a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_3a8,(char (*) [5])0xf40df5);
    local_3c0 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
    local_3c8 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
    local_3c8 = local_3c8 + 1;
    local_3b8 = tcu::formatArray<float*>((float **)&local_3c0,(float **)&local_3c8);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3b8);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3a8);
    pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
    if (((*pafVar6)[0] == -1.0) && (!NAN((*pafVar6)[0]))) {
      pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
      if (((*pafVar6)[1] == -1.0) && (!NAN((*pafVar6)[1]))) {
        pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                            ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
        if (((*pafVar6)[2] == -1.0) && (!NAN((*pafVar6)[2]))) {
          pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)&gl.m_enableLog)
          ;
          if (((*pafVar6)[3] == 1.0) && (!NAN((*pafVar6)[3]))) {
            pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                      operator_cast_to_function_pointer
                                ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
            if (((*pafVar6)[4] == 1.0) && (!NAN((*pafVar6)[4]))) {
              pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                        operator_cast_to_function_pointer
                                  ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
              if (((*pafVar6)[5] == 1.0) && (!NAN((*pafVar6)[5]))) {
                pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                          operator_cast_to_function_pointer
                                    ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
                if (((*pafVar6)[6] == 1.0) && (!NAN((*pafVar6)[6]))) {
                  pafVar6 = gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                            operator_cast_to_function_pointer
                                      ((StateQueryMemoryWriteGuard *)&gl.m_enableLog);
                  if (((*pafVar6)[7] == 1.0) && (!NAN((*pafVar6)[7]))) {
                    tcu::TestContext::setTestResult
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                               QP_TEST_RESULT_PASS,"Pass");
                    goto LAB_009c0b18;
                  }
                }
              }
            }
          }
        }
      }
    }
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_548,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [24])"Error, unexpected value");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_548);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid initial value");
  }
LAB_009c0b18:
  local_224 = 1;
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_90);
  return STOP;
}

Assistant:

InitialValueCase::IterateResult InitialValueCase::iterate (void)
{
	StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLfloat[8]>	state;
	glu::CallLogWrapper											gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	gl.enableLogging(true);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Querying GL_PRIMITIVE_BOUNDING_BOX_EXT, expecting (-1, -1, -1, 1) (1, 1, 1, 1)"
		<< tcu::TestLog::EndMessage;

	gl.glGetFloatv(GL_PRIMITIVE_BOUNDING_BOX_EXT, state);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "query");

	if (!state.verifyValidity(m_testCtx))
		return STOP;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Got " << tcu::formatArray(&state[0], &state[8])
		<< tcu::TestLog::EndMessage;

	if ((state[0] != -1.0f) || (state[1] != -1.0f) || (state[2] != -1.0f) || (state[3] != 1.0f) ||
		(state[4] !=  1.0f) || (state[5] !=  1.0f) || (state[6] !=  1.0f) || (state[7] != 1.0f))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Error, unexpected value"
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid initial value");
	}
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}